

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::DoPreConfigureChecks(cmake *this)

{
  cmState *pcVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  int iVar5;
  allocator local_1f1;
  string currentStart;
  string message;
  string srcList;
  ostringstream err;
  
  pcVar3 = GetHomeDirectory(this);
  std::__cxx11::string::string((string *)&srcList,pcVar3,(allocator *)&err);
  std::__cxx11::string::append((char *)&srcList);
  bVar2 = cmsys::SystemTools::FileExists(srcList._M_dataplus._M_p);
  if (bVar2) {
    pcVar1 = this->State;
    std::__cxx11::string::string((string *)&err,"CMAKE_HOME_DIRECTORY",(allocator *)&currentStart);
    pcVar3 = cmState::GetInitializedCacheValue(pcVar1,(string *)&err);
    std::__cxx11::string::~string((string *)&err);
    if (pcVar3 == (char *)0x0) {
      iVar5 = 0;
    }
    else {
      pcVar1 = this->State;
      std::__cxx11::string::string
                ((string *)&currentStart,"CMAKE_HOME_DIRECTORY",(allocator *)&message);
      pcVar3 = cmState::GetInitializedCacheValue(pcVar1,&currentStart);
      std::__cxx11::string::string((string *)&err,pcVar3,&local_1f1);
      std::__cxx11::string::~string((string *)&currentStart);
      std::__cxx11::string::append((char *)&err);
      pcVar3 = GetHomeDirectory(this);
      std::__cxx11::string::string((string *)&currentStart,pcVar3,(allocator *)&message);
      std::__cxx11::string::append((char *)&currentStart);
      bVar2 = cmsys::SystemTools::SameFile((string *)&err,&currentStart);
      if (bVar2) {
        iVar5 = 1;
      }
      else {
        std::__cxx11::string::string((string *)&message,"The source \"",&local_1f1);
        std::__cxx11::string::append((string *)&message);
        std::__cxx11::string::append((char *)&message);
        std::__cxx11::string::append((string *)&message);
        std::__cxx11::string::append((char *)&message);
        std::__cxx11::string::append((char *)&message);
        cmSystemTools::Error(message._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
        std::__cxx11::string::~string((string *)&message);
        iVar5 = -2;
      }
      std::__cxx11::string::~string((string *)&currentStart);
      std::__cxx11::string::~string((string *)&err);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
    pcVar3 = GetHomeDirectory(this);
    std::__cxx11::string::string((string *)&currentStart,pcVar3,(allocator *)&message);
    bVar2 = cmsys::SystemTools::FileIsDirectory(&currentStart);
    std::__cxx11::string::~string((string *)&currentStart);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&err,"The source directory \"");
      pcVar3 = GetHomeDirectory(this);
      poVar4 = std::operator<<(poVar4,pcVar3);
      pcVar3 = "\" does not appear to contain CMakeLists.txt.\n";
    }
    else {
      pcVar3 = GetHomeDirectory(this);
      bVar2 = cmsys::SystemTools::FileExists(pcVar3);
      if (bVar2) {
        poVar4 = std::operator<<((ostream *)&err,"The source directory \"");
        pcVar3 = GetHomeDirectory(this);
        poVar4 = std::operator<<(poVar4,pcVar3);
        pcVar3 = "\" is a file, not a directory.\n";
      }
      else {
        poVar4 = std::operator<<((ostream *)&err,"The source directory \"");
        pcVar3 = GetHomeDirectory(this);
        poVar4 = std::operator<<(poVar4,pcVar3);
        pcVar3 = "\" does not exist.\n";
      }
    }
    std::operator<<(poVar4,pcVar3);
    std::operator<<((ostream *)&err,
                    "Specify --help for usage, or press the help button on the CMake GUI.");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(currentStart._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string((string *)&currentStart);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
    iVar5 = -2;
  }
  std::__cxx11::string::~string((string *)&srcList);
  return iVar5;
}

Assistant:

int cmake::DoPreConfigureChecks()
{
  // Make sure the Source directory contains a CMakeLists.txt file.
  std::string srcList = this->GetHomeDirectory();
  srcList += "/CMakeLists.txt";
  if(!cmSystemTools::FileExists(srcList.c_str()))
    {
    std::ostringstream err;
    if(cmSystemTools::FileIsDirectory(this->GetHomeDirectory()))
      {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not appear to contain CMakeLists.txt.\n";
      }
    else if(cmSystemTools::FileExists(this->GetHomeDirectory()))
      {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" is a file, not a directory.\n";
      }
    else
      {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not exist.\n";
      }
    err << "Specify --help for usage, or press the help button on the CMake "
      "GUI.";
    cmSystemTools::Error(err.str().c_str());
    return -2;
    }

  // do a sanity check on some values
  if(this->State->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY"))
    {
    std::string cacheStart =
      this->State->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY");
    cacheStart += "/CMakeLists.txt";
    std::string currentStart = this->GetHomeDirectory();
    currentStart += "/CMakeLists.txt";
    if(!cmSystemTools::SameFile(cacheStart, currentStart))
      {
      std::string message = "The source \"";
      message += currentStart;
      message += "\" does not match the source \"";
      message += cacheStart;
      message += "\" used to generate cache.  ";
      message += "Re-run cmake with a different source directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
      }
    }
  else
    {
    return 0;
    }
  return 1;
}